

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Collision_PDU::Encode(Collision_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Collision_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_IssuingEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_CollidingEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_EventID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8CollisionType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Mass);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Location).super_DataTypeBase);
  return;
}

Assistant:

void Collision_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_IssuingEntityID
           << KDIS_STREAM m_CollidingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8CollisionType
           << m_ui8Padding
           << KDIS_STREAM m_Velocity
           << m_f32Mass
           << KDIS_STREAM m_Location;
}